

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_crl.cpp
# Opt level: O2

bool LoadCRLFromFile(char *szFile,CertificateList *crl)

{
  LoadResult LVar1;
  ostream *poVar2;
  char *pcVar3;
  
  LVar1 = LoadObjectFromFile<CertificateList>(szFile,crl);
  switch(LVar1) {
  case Success:
    return true;
  case FileOpenFail:
    pcVar3 = "Cannot open input file: ";
    break;
  case ParseError:
    pcVar3 = "Malformed CRL - parsing error: ";
    break;
  case DecodeError:
    pcVar3 = "Malformed CRL: ";
    break;
  default:
    goto LAB_0010c919;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  poVar2 = std::operator<<(poVar2,szFile);
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_0010c919:
  return false;
}

Assistant:

bool LoadCRLFromFile(const char* szFile, CertificateList& crl)
{
    LoadResult result = LoadObjectFromFile(szFile, crl);

    switch (result)
    {
    case LoadResult::Success:
        return true;

    case LoadResult::DecodeError:
        std::cout << "Malformed CRL: " << szFile << std::endl;
        break;

    case LoadResult::ParseError:
        std::cout << "Malformed CRL - parsing error: " << szFile << std::endl;
        break;

    case LoadResult::FileOpenFail:
        std::cout << "Cannot open input file: " << szFile << std::endl;
        break;
    
    }

    return false;
}